

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

Reader __thiscall capnp::_::OrphanBuilder::asTextReader(OrphanBuilder *this)

{
  SegmentBuilder **ppSVar1;
  byte bVar2;
  uint uVar3;
  ReadLimiter *pRVar4;
  word *pwVar5;
  Arena *pAVar6;
  size_t sVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  OrphanBuilder *pOVar15;
  SegmentBuilder **ppSVar16;
  SegmentBuilder **ppSVar17;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *this_00;
  bool bVar18;
  Reader RVar19;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> _kjCondition;
  SegmentReader *newSegment;
  SegmentBuilder *local_38;
  uint size;
  
  this_00 = &_kjCondition;
  local_38 = this->segment;
  ppSVar16 = (SegmentBuilder **)this->location;
  uVar3 = (uint)(this->tag).content;
  sVar10 = 1;
  ppSVar17 = (SegmentBuilder **)0x1bf653;
  if (*(int *)((long)&(this->tag).content + 4) == 0 && uVar3 == 0) goto LAB_001534ba;
  if ((uVar3 & 3) == 2 && local_38 != (SegmentBuilder *)0x0) {
    iVar8 = (*((local_38->super_SegmentReader).arena)->_vptr_Arena[2])();
    local_38 = (SegmentBuilder *)CONCAT44(extraout_var,iVar8);
    _kjCondition.left = (SegmentReader **)&local_38;
    _kjCondition.right = (void *)0x0;
    _kjCondition.op.content.ptr = " != ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = local_38 != (SegmentBuilder *)0x0;
    if (local_38 == (SegmentBuilder *)0x0) {
      this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x244,FAILED,"segment != nullptr",
                 "_kjCondition,\"Message contains far pointer to unknown segment.\"",&_kjCondition,
                 (char (*) [49])"Message contains far pointer to unknown segment.");
    }
    else {
      uVar3 = (uint)(this->tag).content;
      uVar14 = (ulong)(uVar3 >> 3);
      uVar9 = (local_38->super_SegmentReader).ptr.size_;
      if ((long)uVar9 < (long)uVar14) {
        uVar14 = uVar9;
      }
      uVar11 = 2 - (ulong)((uVar3 & 4) == 0);
      if (uVar14 + uVar11 <= uVar9) {
        pOVar15 = (OrphanBuilder *)((local_38->super_SegmentReader).ptr.ptr + uVar14);
        pRVar4 = (local_38->super_SegmentReader).readLimiter;
        uVar9 = pRVar4->limit;
        if (uVar11 <= uVar9) {
          pRVar4->limit = uVar9 - uVar11;
          if (((this->tag).content & 4) != 0) {
            pAVar6 = (local_38->super_SegmentReader).arena;
            iVar8 = (*pAVar6->_vptr_Arena[2])
                              (pAVar6,(ulong)*(uint *)((long)&(pOVar15->tag).content + 4));
            newSegment = (SegmentReader *)CONCAT44(extraout_var_00,iVar8);
            _kjCondition.left = &newSegment;
            _kjCondition.right = (void *)0x0;
            _kjCondition.op.content.ptr = " != ";
            _kjCondition.op.content.size_ = 5;
            _kjCondition.result = (SegmentBuilder *)newSegment != (SegmentBuilder *)0x0;
            if ((SegmentBuilder *)newSegment == (SegmentBuilder *)0x0) {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                        ((Fault *)&size,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x25f,FAILED,"newSegment != nullptr",
                         "_kjCondition,\"Message contains double-far pointer to unknown segment.\"",
                         &_kjCondition,
                         (char (*) [56])"Message contains double-far pointer to unknown segment.");
LAB_00153542:
              ppSVar16 = (SegmentBuilder **)0x0;
              kj::_::Debug::Fault::~Fault((Fault *)&size);
            }
            else {
              uVar3 = (uint)(pOVar15->tag).content;
              uVar13 = uVar3 & 3;
              _kjCondition.left = (SegmentReader **)CONCAT44(2,uVar13);
              _kjCondition.right = anon_var_dwarf_1f258;
              _kjCondition.op.content.ptr = (char *)0x5;
              _kjCondition.op.content.size_ = (size_t)(uVar13 == 2);
              if (uVar13 != 2) {
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                          ((Fault *)&size,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                           "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                           (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind>
                            *)&_kjCondition,
                           (char (*) [51])"Second word of double-far pad must be far pointer.");
                goto LAB_00153542;
              }
              uVar9 = (ulong)(uVar3 >> 3);
              sVar7 = (((SegmentBuilder *)newSegment)->super_SegmentReader).ptr.size_;
              if ((long)sVar7 < (long)uVar9) {
                uVar9 = sVar7;
              }
              ppSVar16 = (SegmentBuilder **)
                         ((((SegmentBuilder *)newSegment)->super_SegmentReader).ptr.ptr + uVar9);
              local_38 = (SegmentBuilder *)newSegment;
            }
            this = (OrphanBuilder *)&pOVar15->segment;
            goto LAB_00153125;
          }
          ppSVar1 = &pOVar15->segment;
          lVar12 = (long)((int)(pOVar15->tag).content >> 2);
          this = pOVar15;
          if ((local_38 != (SegmentBuilder *)0x0) &&
             ((pwVar5 = (local_38->super_SegmentReader).ptr.ptr,
              ppSVar16 = (SegmentBuilder **)(pwVar5 + (local_38->super_SegmentReader).ptr.size_),
              lVar12 < (long)pwVar5 - (long)ppSVar1 >> 3 ||
              ((long)ppSVar16 - (long)ppSVar1 >> 3 < lVar12)))) goto LAB_00153125;
          ppSVar16 = ppSVar1 + lVar12;
          goto LAB_0015312e;
        }
        (*((local_38->super_SegmentReader).arena)->_vptr_Arena[3])();
      }
      newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
                ((Fault *)&_kjCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
                 "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                 ,(DebugExpression<bool> *)&newSegment,
                 (char (*) [318])
                 "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                );
    }
  }
  else {
LAB_00153125:
    if (ppSVar16 == (SegmentBuilder **)0x0) goto LAB_001534ba;
LAB_0015312e:
    this_00 = &_kjCondition;
    uVar3 = *(uint *)((long)&(this->tag).content + 4);
    size = uVar3 >> 3;
    uVar13 = (uint)(this->tag).content & 3;
    _kjCondition.left = (SegmentReader **)CONCAT44(1,uVar13);
    _kjCondition.right = anon_var_dwarf_1f258;
    _kjCondition.op.content.ptr = (char *)0x5;
    _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar13 == 1);
    if (uVar13 == 1) {
      bVar2 = *(byte *)((long)&(this->tag).content + 4);
      _kjCondition.left =
           (SegmentReader **)(CONCAT71(_kjCondition.left._1_7_,bVar2) & 0xffffffffffffff07);
      _kjCondition.left._0_2_ = CONCAT11(2,_kjCondition.left._0_1_);
      _kjCondition.right = anon_var_dwarf_1f258;
      _kjCondition.op.content.ptr = (char *)0x5;
      bVar18 = (bVar2 & 7) == 2;
      _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,bVar18);
      if (bVar18) {
        if (local_38 == (SegmentBuilder *)0x0) {
LAB_001533e6:
          _kjCondition.right = (void *)0x0;
          _kjCondition.result = uVar3 >= 8;
          _kjCondition.left = (SegmentReader **)&size;
          _kjCondition.op.content.ptr = " > ";
          _kjCondition.op.content.size_ = 4;
          if (uVar3 < 8) {
            this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int>&,char_const(&)[50]>
                      ((Fault *)this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x9b0,FAILED,"size > ZERO * BYTES",
                       "_kjCondition,\"Message contains text that is not NUL-terminated.\"",
                       (DebugComparison<unsigned_int_&,_unsigned_int> *)&_kjCondition,
                       (char (*) [50])"Message contains text that is not NUL-terminated.");
          }
          else {
            uVar9 = (ulong)(size - 1);
            _kjCondition.result = *(char *)((long)ppSVar16 + uVar9) == '\0';
            _kjCondition.left = (SegmentReader **)((long)ppSVar16 + uVar9);
            _kjCondition.right = (void *)0x0;
            _kjCondition.op.content.ptr = " == ";
            _kjCondition.op.content.size_ = 5;
            if (_kjCondition.result) {
              sVar10 = uVar9 + 1;
              ppSVar17 = ppSVar16;
              goto LAB_001534ba;
            }
            this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<char_const&,char>&,char_const(&)[50]>
                      ((Fault *)this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x9b7,FAILED,"cptr[unboundedSize] == \'\\0\'",
                       "_kjCondition,\"Message contains text that is not NUL-terminated.\"",
                       (DebugComparison<const_char_&,_char> *)&_kjCondition,
                       (char (*) [50])"Message contains text that is not NUL-terminated.");
          }
        }
        else {
          uVar9 = (ulong)(size + 7 >> 3);
          if (((long)ppSVar16 - (long)(local_38->super_SegmentReader).ptr.ptr >> 3) + uVar9 <=
              (local_38->super_SegmentReader).ptr.size_) {
            pRVar4 = (local_38->super_SegmentReader).readLimiter;
            uVar14 = pRVar4->limit;
            if (uVar9 <= uVar14) {
              pRVar4->limit = uVar14 - uVar9;
              goto LAB_001533e6;
            }
            (*((local_38->super_SegmentReader).arena)->_vptr_Arena[3])();
          }
          newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[320]>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x9ac,FAILED,"boundsCheck(segment, ptr, roundBytesUpToWords(size))",
                     "_kjCondition,\"Message contained out-of-bounds text pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                     ,(DebugExpression<bool> *)&newSegment,
                     (char (*) [320])
                     "Message contained out-of-bounds text pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                    );
        }
      }
      else {
        this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize,capnp::ElementSize>&,char_const(&)[85]>
                  ((Fault *)this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x9a6,FAILED,"ref->listRef.elementSize() == ElementSize::BYTE",
                   "_kjCondition,\"Schema mismatch: Message contains list pointer of non-bytes where text was \" \"expected.\""
                   ,(DebugComparison<capnp::ElementSize,_capnp::ElementSize> *)&_kjCondition,
                   (char (*) [85])
                   "Schema mismatch: Message contains list pointer of non-bytes where text was expected."
                  );
      }
    }
    else {
      this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[76]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x9a0,FAILED,"ref->kind() == WirePointer::LIST",
                 "_kjCondition,\"Schema mismatch: Message contains non-list pointer where text was expected.\""
                 ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                  &_kjCondition,
                 (char (*) [76])
                 "Schema mismatch: Message contains non-list pointer where text was expected.");
    }
  }
  kj::_::Debug::Fault::~Fault((Fault *)this_00);
LAB_001534ba:
  RVar19.super_StringPtr.content.size_ = sVar10;
  RVar19.super_StringPtr.content.ptr = (char *)ppSVar17;
  return (Reader)RVar19.super_StringPtr.content;
}

Assistant:

Text::Reader OrphanBuilder::asTextReader() const {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));
  return WireHelpers::readTextPointer(segment, tagAsPtr(), location, nullptr, ZERO * BYTES);
}